

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O2

void __thiscall FatSystem::readFile(FatSystem *this,uint cluster,uint size,FILE *f,bool deleted)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  FILE *__s;
  bool bVar4;
  uint uVar5;
  unsigned_long_long address;
  undefined3 in_register_00000081;
  char *buffer;
  ulong uVar6;
  char *pcVar7;
  undefined1 auStack_58 [8];
  undefined1 *local_50;
  FILE *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_34 = CONCAT31(in_register_00000081,deleted);
  local_50 = auStack_58;
  local_48 = (FILE *)f;
  if (f == (FILE *)0x0) {
    local_48 = _stdout;
  }
  uVar6 = (ulong)local_34;
  do {
    while( true ) {
      if ((size == 0) || (cluster == 0xffffffff)) {
        return;
      }
      uVar1 = this->bytesPerCluster;
      uVar5 = (uint)uVar1;
      if ((ulong)(long)(int)size <= uVar1) {
        uVar5 = size;
      }
      local_38 = (uint)uVar6;
      buffer = local_50 + -(uVar1 + 0xf & 0xfffffffffffffff0);
      buffer[-8] = -0x80;
      buffer[-7] = -5;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      address = clusterAddress(this,cluster,false);
      buffer[-8] = -0x6f;
      buffer[-7] = -5;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      readData(this,address,buffer,uVar5);
      local_3c = size - uVar5;
      if (size == 0xffffffff) {
        local_3c = size;
      }
      buffer[-8] = '\x01';
      __s = local_48;
      buffer[-7] = '\0';
      buffer[-6] = '\0';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      sVar2 = *(size_t *)(buffer + -8);
      buffer[-8] = -0x4c;
      buffer[-7] = -5;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      fwrite(buffer,(long)(int)uVar5,sVar2,__s);
      buffer[-8] = -0x44;
      buffer[-7] = -5;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      fflush(__s);
      if ((local_38 & 1) == 0) break;
      if ((char)local_34 == '\0') {
        buffer[-8] = '\0';
        buffer[-7] = -4;
        buffer[-6] = '\x10';
        buffer[-5] = '\0';
        buffer[-4] = '\0';
        buffer[-3] = '\0';
        buffer[-2] = '\0';
        buffer[-1] = '\0';
        bVar4 = freeCluster(this,cluster);
        pcVar7 = buffer;
        if (!bVar4) {
          buffer[-8] = '8';
          buffer[-7] = '\0';
          buffer[-6] = '\0';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          sVar2 = *(size_t *)(buffer + -8);
          buffer[-8] = '\x01';
          buffer[-7] = '\0';
          buffer[-6] = '\0';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          sVar3 = *(size_t *)(buffer + -8);
          buffer[-8] = 'k';
          buffer[-7] = -4;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          fwrite("! Contiguous file contains cluster that seems allocated\n",sVar2,sVar3,_stderr);
          buffer[-8] = '$';
          buffer[-7] = '\0';
          buffer[-6] = '\0';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          sVar2 = *(size_t *)(buffer + -8);
          buffer[-8] = -0x80;
          buffer[-7] = -4;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          fwrite("! Trying to disable contiguous mode\n",sVar2,sVar3,_stderr);
          buffer[-8] = -0x70;
          buffer[-7] = -4;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          uVar5 = nextCluster(this,cluster,0);
          goto LAB_0010fbf0;
        }
LAB_0010fc04:
        cluster = cluster + 1;
        buffer = pcVar7;
      }
      else {
        do {
          cluster = cluster + 1;
          buffer[-8] = -0x2a;
          buffer[-7] = -5;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          bVar4 = freeCluster(this,cluster);
        } while (!bVar4);
      }
      uVar6 = CONCAT71((int7)((ulong)buffer >> 8),1);
      size = local_3c;
    }
    buffer[-8] = -0x14;
    buffer[-7] = -5;
    buffer[-6] = '\x10';
    buffer[-5] = '\0';
    buffer[-4] = '\0';
    buffer[-3] = '\0';
    buffer[-2] = '\0';
    buffer[-1] = '\0';
    uVar5 = nextCluster(this,cluster,0);
    if (uVar5 == 0) {
      pcVar7 = &stderr;
      buffer[-8] = 'R';
      buffer[-7] = '\0';
      buffer[-6] = '\0';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      sVar2 = *(size_t *)(buffer + -8);
      buffer[-8] = '\x01';
      buffer[-7] = '\0';
      buffer[-6] = '\0';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      sVar3 = *(size_t *)(buffer + -8);
      buffer[-8] = '5';
      buffer[-7] = -4;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      fwrite("! One of your file\'s cluster is 0 (maybe FAT is broken, have a look to -2 and -m)\n",
             sVar2,sVar3,_stderr);
      buffer[-8] = '\"';
      buffer[-7] = '\0';
      buffer[-6] = '\0';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      sVar2 = *(size_t *)(buffer + -8);
      buffer[-8] = 'J';
      buffer[-7] = -4;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      fwrite("! Trying to enable contigous mode\n",sVar2,sVar3,_stderr);
      goto LAB_0010fc04;
    }
LAB_0010fbf0:
    cluster = uVar5;
    uVar6 = 0;
    size = local_3c;
  } while( true );
}

Assistant:

void FatSystem::readFile(unsigned int cluster, unsigned int size, FILE *f, bool deleted)
{
    bool contiguous = deleted;

    if (f == NULL) {
        f = stdout;
    }

    while ((size!=0) && cluster!=FAT_LAST) {
        int currentCluster = cluster;
        int toRead = size;
        if (toRead > bytesPerCluster || size < 0) {
            toRead = bytesPerCluster;
        }
#ifndef __WIN__
        char buffer[bytesPerCluster];
#else
                char *buffer = new char[bytesPerCluster];
                __try
                {
#endif
        readData(clusterAddress(cluster), buffer, toRead);

        if (size != -1) {
            size -= toRead;
        }

        // Write file data to the given file
        fwrite(buffer, toRead, 1, f);
        fflush(f);

        if (contiguous) {
            if (deleted) {
                do {
                    cluster++;
                } while (!freeCluster(cluster));
            } else {
                if (!freeCluster(cluster)) {
                    fprintf(stderr, "! Contiguous file contains cluster that seems allocated\n");
                    fprintf(stderr, "! Trying to disable contiguous mode\n");
                    contiguous = false;
                    cluster = nextCluster(cluster);
                } else {
                    cluster++;
                }
            }
        } else {
            cluster = nextCluster(currentCluster);

            if (cluster == 0) {
                fprintf(stderr, "! One of your file's cluster is 0 (maybe FAT is broken, have a look to -2 and -m)\n");
                fprintf(stderr, "! Trying to enable contigous mode\n");
                contiguous = true;
                cluster = currentCluster+1;
            }
        }
#ifdef __WIN__
    }
    __finally
    {
        delete[] buffer;
    }
#endif
    }
}